

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O0

bool __thiscall
HookStateStop::Start(HookStateStop *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  element_type *this_00;
  element_type *this_01;
  EmmyDebuggerManager *pEVar1;
  shared_ptr<HookState> local_38;
  lua_State *local_28;
  lua_State *current_local;
  shared_ptr<Debugger> *debugger_local;
  HookStateStop *this_local;
  
  if (current != (lua_State *)0x0) {
    local_28 = current;
    current_local = (lua_State *)debugger;
    debugger_local = (shared_ptr<Debugger> *)this;
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         debugger);
    this_01 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         debugger);
    pEVar1 = Debugger::GetEmmyDebuggerManager(this_01);
    std::shared_ptr<HookState>::shared_ptr<HookStateContinue,void>(&local_38,&pEVar1->stateContinue)
    ;
    Debugger::SetHookState(this_00,&local_38);
    std::shared_ptr<HookState>::~shared_ptr(&local_38);
  }
  return current != (lua_State *)0x0;
}

Assistant:

bool HookStateStop::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (current == nullptr)
		return false;

	// 不能取消当前hook
	// 当unity 停止play之后附加调试依然运行，此时lua虚拟机可能已经销毁
	// 所以以下操作会导致进程崩溃
	// debugger->UpdateHook(0, current);
	
	// 此处会引发递归加锁而报错，而如果使用递归锁对调试体验影响
	// debugger->DoAction(DebugAction::Continue);
	debugger->SetHookState(debugger->GetEmmyDebuggerManager()->stateContinue);

	return true;
}